

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Window_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Class_Type::write_code2(Fl_Widget_Class_Type *this)

{
  uint uVar1;
  char *pcVar2;
  Fl_Widget *pFVar3;
  Fl_Widget_Class_Type *this_local;
  
  Fl_Widget_Type::write_extra_code((Fl_Widget_Type *)this);
  if (this->wc_relative != '\0') {
    pcVar2 = indent();
    write_c("%sposition(X, Y);\n",pcVar2);
  }
  if ((this->super_Fl_Window_Type).modal == '\0') {
    if ((this->super_Fl_Window_Type).non_modal != '\0') {
      pcVar2 = indent();
      write_c("%sset_non_modal();\n",pcVar2);
    }
  }
  else {
    pcVar2 = indent();
    write_c("%sset_modal();\n",pcVar2);
  }
  uVar1 = Fl_Window::border((Fl_Window *)(this->super_Fl_Window_Type).super_Fl_Widget_Type.o);
  if (uVar1 == 0) {
    pcVar2 = indent();
    write_c("%sclear_border();\n",pcVar2);
  }
  if ((this->super_Fl_Window_Type).super_Fl_Widget_Type.xclass != (char *)0x0) {
    pcVar2 = indent();
    write_c("%sxclass(",pcVar2);
    write_cstring((this->super_Fl_Window_Type).super_Fl_Widget_Type.xclass);
    write_c(");\n");
  }
  pcVar2 = indent();
  write_c("%send();\n",pcVar2);
  pFVar3 = Fl_Group::resizable((Fl_Group *)(this->super_Fl_Window_Type).super_Fl_Widget_Type.o);
  if (pFVar3 == (this->super_Fl_Window_Type).super_Fl_Widget_Type.o) {
    pcVar2 = indent();
    write_c("%sresizable(this);\n",pcVar2);
  }
  write_c("}\n");
  return;
}

Assistant:

void Fl_Widget_Class_Type::write_code2() {
  write_extra_code();
  if (wc_relative) write_c("%sposition(X, Y);\n", indent());
  if (modal) write_c("%sset_modal();\n", indent());
  else if (non_modal) write_c("%sset_non_modal();\n", indent());
  if (!((Fl_Window*)o)->border()) write_c("%sclear_border();\n", indent());
  if (xclass) {
    write_c("%sxclass(", indent());
    write_cstring(xclass);
    write_c(");\n");
  }
  write_c("%send();\n", indent());
  if (((Fl_Window*)o)->resizable() == o)
    write_c("%sresizable(this);\n", indent());
  write_c("}\n");
}